

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

pair<unsigned_int,_unsigned_int> * __thiscall
spirv_cross::AlignedBuffer<std::pair<unsigned_int,_unsigned_int>,_8UL>::data
          (AlignedBuffer<std::pair<unsigned_int,_unsigned_int>,_8UL> *this)

{
  AlignedBuffer<std::pair<unsigned_int,_unsigned_int>,_8UL> *this_local;
  
  return (pair<unsigned_int,_unsigned_int> *)this;
}

Assistant:

T *data()
	{
#if defined(_MSC_VER) && _MSC_VER < 1900
		// MSVC 2013 workarounds, sigh ...
		// Only use this workaround on MSVC 2013 due to some confusion around default initialized unions.
		// Spec seems to suggest the memory will be zero-initialized, which is *not* what we want.
		return reinterpret_cast<T *>(u.aligned_char);
#else
		return reinterpret_cast<T *>(aligned_char);
#endif
	}